

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_file_current_dir(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int in_ECX;
  int extraout_EDX;
  char *__s1;
  uv_fs_event_t *puVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_timer_t timer;
  code *pcStack_a0;
  undefined1 local_98 [16];
  char *local_88 [15];
  
  pcStack_a0 = (code *)0x1886e5;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1886f7;
  remove("watch_file");
  pcStack_a0 = (code *)0x1886ff;
  create_file("watch_file");
  pcStack_a0 = (code *)0x18870e;
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  local_88[0] = (char *)(long)iVar1;
  local_98._0_8_ = (uv_loop_t *)0x0;
  if (local_88[0] == (char *)0x0) {
    in_ECX = 0;
    pcStack_a0 = (code *)0x18874b;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,"watch_file");
    local_88[0] = (char *)(long)iVar1;
    local_98._0_8_ = (uv_loop_t *)0x0;
    if (local_88[0] != (char *)0x0) goto LAB_00188915;
    pcStack_a0 = (code *)0x188776;
    iVar1 = uv_timer_init(uVar2,local_88);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188922;
    local_88[0] = "watch_file";
    in_ECX = 0;
    pcStack_a0 = (code *)0x1887af;
    iVar1 = uv_timer_start(local_88,timer_cb_touch,0x44c);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_0018892f;
    local_98._0_8_ = SEXT48(timer_cb_touch_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_0018893c;
    local_98._0_8_ = SEXT48(fs_event_cb_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188949;
    local_98._0_8_ = SEXT48(close_cb_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188956;
    pcStack_a0 = (code *)0x188840;
    uv_run(uVar2,0);
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_00188963;
    local_98._0_8_ = (uv_loop_t *)0x0;
    local_98._8_8_ = SEXT48(fs_event_cb_called);
    if ((uv_loop_t *)local_98._8_8_ == (uv_loop_t *)0x0) goto LAB_00188970;
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_0018897d;
    pcStack_a0 = (code *)0x1888b5;
    remove("watch_file");
    pcStack_a0 = (code *)0x1888c6;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_a0 = (code *)0x1888d0;
    uv_run(uVar2,0);
    local_98._0_8_ = (uv_loop_t *)0x0;
    pcStack_a0 = (code *)0x1888e0;
    iVar1 = uv_loop_close(uVar2);
    local_98._8_8_ = SEXT48(iVar1);
    if (local_98._0_8_ == local_98._8_8_) {
      pcStack_a0 = (code *)0x1888fb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x188915;
    run_test_fs_event_watch_file_current_dir_cold_1();
LAB_00188915:
    pcStack_a0 = (code *)0x188922;
    run_test_fs_event_watch_file_current_dir_cold_2();
LAB_00188922:
    pcStack_a0 = (code *)0x18892f;
    run_test_fs_event_watch_file_current_dir_cold_3();
LAB_0018892f:
    pcStack_a0 = (code *)0x18893c;
    run_test_fs_event_watch_file_current_dir_cold_4();
LAB_0018893c:
    pcStack_a0 = (code *)0x188949;
    run_test_fs_event_watch_file_current_dir_cold_5();
LAB_00188949:
    pcStack_a0 = (code *)0x188956;
    run_test_fs_event_watch_file_current_dir_cold_6();
LAB_00188956:
    pcStack_a0 = (code *)0x188963;
    run_test_fs_event_watch_file_current_dir_cold_7();
LAB_00188963:
    pcStack_a0 = (code *)0x188970;
    run_test_fs_event_watch_file_current_dir_cold_8();
LAB_00188970:
    pcStack_a0 = (code *)0x18897d;
    run_test_fs_event_watch_file_current_dir_cold_11();
LAB_0018897d:
    pcStack_a0 = (code *)0x18898a;
    run_test_fs_event_watch_file_current_dir_cold_9();
  }
  puVar3 = (uv_fs_event_t *)local_98;
  __s1 = local_98 + 8;
  pcStack_a0 = fs_event_cb_file_current_dir;
  run_test_fs_event_watch_file_current_dir_cold_10();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    pcStack_a0 = (code *)(long)in_ECX;
    if (pcStack_a0 != (code *)0x0) goto LAB_00188a31;
    pcStack_a0 = (code *)(long)extraout_EDX;
    if (pcStack_a0 == (code *)0x2) {
      iVar1 = strcmp(__s1,"watch_file");
      pcStack_a0 = (code *)(long)iVar1;
      if (pcStack_a0 == (code *)0x0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00188a4f;
    }
  }
  else {
    fs_event_cb_file_current_dir_cold_1();
LAB_00188a31:
    fs_event_cb_file_current_dir_cold_2();
  }
  fs_event_cb_file_current_dir_cold_3();
LAB_00188a4f:
  ppcVar4 = &pcStack_a0;
  fs_event_cb_file_current_dir_cold_4();
  uv_close();
  touch_file((char *)*ppcVar4);
  timer_cb_touch_called = timer_cb_touch_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_watch_file_current_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");
#if defined(__APPLE__) && !defined(MAC_OS_X_VERSION_10_12)
  /* Empirically, kevent seems to (sometimes) report the preceding
   * create_file events prior to macOS 10.11.6 in the subsequent fs_event_start
   * So let the system settle before running the test. */
  uv_sleep(1100);
  uv_update_time(loop);
#endif

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT_OK(r);


  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  timer.data = "watch_file";
  r = uv_timer_start(&timer, timer_cb_touch, 1100, 0);
  ASSERT_OK(r);

  ASSERT_OK(timer_cb_touch_called);
  ASSERT_OK(fs_event_cb_called);
  ASSERT_OK(close_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, timer_cb_touch_called);
  /* FSEvents on macOS sometimes sends one change event, sometimes two. */
  ASSERT_NE(0, fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_file");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}